

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptorTables::AddFieldByNumber
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  __node_base *p_Var1;
  size_type *psVar2;
  int iVar3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  __buckets_ptr pp_Var6;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var7;
  _Hash_node_base *p_Var8;
  ulong uVar9;
  size_type __n;
  _Hash_node_base _Var10;
  _Hash_node_base *p_Var11;
  ulong uVar12;
  _Hash_node_base *p_Var13;
  undefined1 auVar14 [16];
  __buckets_alloc_type __alloc;
  pointer __ptr_1;
  new_allocator<std::__detail::_Hash_node_base_*> local_39;
  _Hash_node_base *local_38;
  
  p_Var4 = *(_Hash_node_base **)(field + 0x58);
  iVar3 = *(int *)(field + 0x38);
  p_Var13 = (_Hash_node_base *)((long)p_Var4 * 0xffff + (long)iVar3);
  uVar12 = (this->fields_by_number_).
           super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
           ._M_h._M_bucket_count;
  uVar9 = (ulong)p_Var13 % uVar12;
  p_Var5 = (this->fields_by_number_).
           super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
           ._M_h._M_buckets[uVar9];
  if (p_Var5 != (__node_base_ptr)0x0) {
    p_Var11 = p_Var5->_M_nxt;
    p_Var8 = p_Var11[4]._M_nxt;
    do {
      if (((p_Var8 == p_Var13) && (p_Var11[1]._M_nxt == p_Var4)) &&
         (*(int *)&p_Var11[2]._M_nxt == iVar3)) {
        return false;
      }
      p_Var11 = p_Var11->_M_nxt;
    } while ((p_Var11 != (_Hash_node_base *)0x0) &&
            (p_Var8 = p_Var11[4]._M_nxt, (ulong)p_Var8 % uVar12 == uVar9));
  }
  local_38 = (_Hash_node_base *)operator_new(0x28);
  local_38->_M_nxt = (_Hash_node_base *)0x0;
  local_38[1]._M_nxt = p_Var4;
  *(int *)&local_38[2]._M_nxt = iVar3;
  local_38[3]._M_nxt = (_Hash_node_base *)field;
  auVar14 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&(this->fields_by_number_).
                               super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                               ._M_h._M_rehash_policy,
                       (this->fields_by_number_).
                       super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                       ._M_h._M_bucket_count,
                       (this->fields_by_number_).
                       super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                       ._M_h._M_element_count);
  __n = auVar14._8_8_;
  if ((auVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __s = (this->fields_by_number_).
          super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
          ._M_h._M_buckets;
  }
  else {
    if (__n == 1) {
      __s = &(this->fields_by_number_).
             super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
             ._M_h._M_single_bucket;
      (this->fields_by_number_).
      super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
      ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    }
    else {
      __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                      (&local_39,__n,(void *)0x0);
      memset(__s,0,__n * 8);
    }
    _Var10._M_nxt =
         (this->fields_by_number_).
         super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
         ._M_h._M_before_begin._M_nxt;
    (this->fields_by_number_).
    super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if (_Var10._M_nxt != (_Hash_node_base *)0x0) {
      p_Var1 = &(this->fields_by_number_).
                super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                ._M_h._M_before_begin;
      uVar12 = 0;
      do {
        p_Var4 = (_Var10._M_nxt)->_M_nxt;
        uVar9 = (ulong)_Var10._M_nxt[4]._M_nxt % __n;
        if (__s[uVar9] == (_Hash_node_base *)0x0) {
          (_Var10._M_nxt)->_M_nxt = p_Var1->_M_nxt;
          p_Var1->_M_nxt = _Var10._M_nxt;
          __s[uVar9] = p_Var1;
          if ((_Var10._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
            pp_Var7 = __s + uVar12;
            goto LAB_005672f7;
          }
        }
        else {
          (_Var10._M_nxt)->_M_nxt = __s[uVar9]->_M_nxt;
          pp_Var7 = &__s[uVar9]->_M_nxt;
          uVar9 = uVar12;
LAB_005672f7:
          *pp_Var7 = _Var10._M_nxt;
        }
        _Var10._M_nxt = p_Var4;
        uVar12 = uVar9;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    pp_Var6 = (this->fields_by_number_).
              super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
              ._M_h._M_buckets;
    if (&(this->fields_by_number_).
         super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
         ._M_h._M_single_bucket != pp_Var6) {
      operator_delete(pp_Var6,(this->fields_by_number_).
                              super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                              ._M_h._M_bucket_count << 3);
    }
    (this->fields_by_number_).
    super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
    ._M_h._M_bucket_count = __n;
    (this->fields_by_number_).
    super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
    ._M_h._M_buckets = __s;
    uVar9 = (ulong)p_Var13 % __n;
  }
  local_38[4]._M_nxt = p_Var13;
  if (__s[uVar9] == (_Hash_node_base *)0x0) {
    p_Var4 = (this->fields_by_number_).
             super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
             ._M_h._M_before_begin._M_nxt;
    local_38->_M_nxt = p_Var4;
    (this->fields_by_number_).
    super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
    ._M_h._M_before_begin._M_nxt = local_38;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      __s[(ulong)p_Var4[4]._M_nxt %
          (this->fields_by_number_).
          super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
          ._M_h._M_bucket_count] = local_38;
      __s = (this->fields_by_number_).
            super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
            ._M_h._M_buckets;
    }
    __s[uVar9] = &(this->fields_by_number_).
                  super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                  ._M_h._M_before_begin;
  }
  else {
    local_38->_M_nxt = __s[uVar9]->_M_nxt;
    __s[uVar9]->_M_nxt = local_38;
  }
  psVar2 = &(this->fields_by_number_).
            super_unordered_map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
            ._M_h._M_element_count;
  *psVar2 = *psVar2 + 1;
  return true;
}

Assistant:

bool FileDescriptorTables::AddFieldByNumber(const FieldDescriptor* field) {
  DescriptorIntPair key(field->containing_type(), field->number());
  return InsertIfNotPresent(&fields_by_number_, key, field);
}